

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_float_field_Test::writer_test_should_write_float_field_Test
          (writer_test_should_write_float_field_Test *this)

{
  writer_test_should_write_float_field_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__writer_test_should_write_float_field_Test_00361800;
  return;
}

Assistant:

TEST(writer_test, should_write_float_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::Price>;
    Field field;

    field.set(17.35);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=17.35|");

    field.set(1234567.45);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1234567.45|");

    field.set(1000000.0);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1000000|");
}